

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_Error cff_charset_compute_cids(CFF_Charset charset,FT_UInt num_glyphs,FT_Memory memory)

{
  uint in_EAX;
  ulong uVar1;
  FT_UShort *pFVar2;
  ushort uVar3;
  FT_Error FVar4;
  ushort uVar5;
  ulong uVar6;
  undefined8 uStack_38;
  FT_Error error;
  
  uStack_38 = (ulong)in_EAX;
  FVar4 = 0;
  if (charset->max_cid == 0) {
    uVar6 = (ulong)num_glyphs;
    uVar3 = 0;
    for (uVar1 = 0; uVar6 != uVar1; uVar1 = uVar1 + 1) {
      uVar5 = charset->sids[uVar1];
      if (charset->sids[uVar1] <= uVar3) {
        uVar5 = uVar3;
      }
      uVar3 = uVar5;
    }
    pFVar2 = (FT_UShort *)
             ft_mem_realloc(memory,2,0,(ulong)uVar3 + 1,(void *)0x0,
                            (FT_Error *)((long)&uStack_38 + 4));
    charset->cids = pFVar2;
    FVar4 = uStack_38._4_4_;
    if (uStack_38._4_4_ == 0) {
      for (; 0 < (long)uVar6; uVar6 = uVar6 - 1) {
        pFVar2[charset->sids[uVar6 - 1]] = (short)uVar6 - 1;
      }
      charset->max_cid = (uint)uVar3;
      charset->num_glyphs = num_glyphs;
      FVar4 = 0;
    }
  }
  return FVar4;
}

Assistant:

static FT_Error
  cff_charset_compute_cids( CFF_Charset  charset,
                            FT_UInt      num_glyphs,
                            FT_Memory    memory )
  {
    FT_Error   error   = FT_Err_Ok;
    FT_UInt    i;
    FT_Long    j;
    FT_UShort  max_cid = 0;


    if ( charset->max_cid > 0 )
      goto Exit;

    for ( i = 0; i < num_glyphs; i++ )
    {
      if ( charset->sids[i] > max_cid )
        max_cid = charset->sids[i];
    }

    if ( FT_NEW_ARRAY( charset->cids, (FT_ULong)max_cid + 1 ) )
      goto Exit;

    /* When multiple GIDs map to the same CID, we choose the lowest */
    /* GID.  This is not described in any spec, but it matches the  */
    /* behaviour of recent Acroread versions.                       */
    for ( j = (FT_Long)num_glyphs - 1; j >= 0; j-- )
      charset->cids[charset->sids[j]] = (FT_UShort)j;

    charset->max_cid    = max_cid;
    charset->num_glyphs = num_glyphs;

  Exit:
    return error;
  }